

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O3

REF_STATUS ref_subdiv_mark_prism_by_metric(REF_SUBDIV ref_subdiv)

{
  REF_INT node0;
  REF_INT node1;
  REF_CELL pRVar1;
  REF_NODE ref_node;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  REF_DBL ratio;
  double local_38;
  
  pRVar1 = ref_subdiv->grid->cell[10];
  iVar2 = pRVar1->max;
  if (0 < iVar2) {
    ref_node = ref_subdiv->grid->node;
    iVar5 = 0;
    do {
      if (pRVar1->c2n[(long)pRVar1->size_per * (long)iVar5] != -1) {
        lVar8 = 0;
        do {
          lVar6 = (long)pRVar1->size_per * (long)iVar5;
          node0 = pRVar1->c2n[pRVar1->e2n[(long)*(int *)((long)&DAT_00220300 + lVar8) * 2] + lVar6];
          node1 = pRVar1->c2n
                  [(long)(int)lVar6 +
                   (long)pRVar1->e2n[*(int *)((long)&DAT_00220300 + lVar8) * 2 + 1]];
          uVar3 = ref_node_ratio(ref_node,node0,node1,&local_38);
          if (uVar3 != 0) {
            pcVar7 = "ratio";
            uVar4 = 0xf2;
LAB_001c6e70:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,uVar4,"ref_subdiv_mark_prism_by_metric",(ulong)uVar3,pcVar7);
            return uVar3;
          }
          if ((1.4142135623730951 < local_38) &&
             (uVar3 = ref_subdiv_mark_to_split(ref_subdiv,node0,node1), uVar3 != 0)) {
            pcVar7 = "sp";
            uVar4 = 0xf4;
            goto LAB_001c6e70;
          }
          lVar8 = lVar8 + 4;
        } while (lVar8 != 0x18);
        iVar2 = pRVar1->max;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < iVar2);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_mark_prism_by_metric(REF_SUBDIV ref_subdiv) {
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_CELL ref_cell = ref_grid_pri(ref_subdiv_grid(ref_subdiv));
  REF_INT cell, cell_edge;
  REF_INT node0, node1;
  REF_DBL ratio, ratio_limit;

  REF_INT tri_cell_edge;
  REF_INT pri_tri_cell_edge[] = {0, 1, 3, 6, 7, 8};

  ratio_limit = sqrt(2.0);

  each_ref_cell_valid_cell(ref_cell, cell) {
    for (tri_cell_edge = 0; tri_cell_edge < 6; tri_cell_edge++) {
      cell_edge = pri_tri_cell_edge[tri_cell_edge];
      node0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      node1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      RSS(ref_node_ratio(ref_node, node0, node1, &ratio), "ratio");
      if (ratio > ratio_limit)
        RSS(ref_subdiv_mark_to_split(ref_subdiv, node0, node1), "sp");
    }
  }

  return REF_SUCCESS;
}